

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O1

void __thiscall cmQtAutoGeneratorMocUic::MocGenerateCompilation(cmQtAutoGeneratorMocUic *this)

{
  FileSystem *this_00;
  Logger *this_01;
  _Rb_tree_header *p_Var1;
  string *filename;
  cmQtAutoGeneratorMocUic *this_02;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  char cVar5;
  string content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  pthread_mutex_t *local_40;
  cmQtAutoGeneratorMocUic *local_38;
  
  local_40 = (pthread_mutex_t *)&this->JobsMutex_;
  iVar3 = pthread_mutex_lock(local_40);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if ((this->JobError_ == false) && ((this->Moc_).Enabled == true)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"// This file is autogenerated. Changes will be overwritten.\n",
               "");
    local_38 = this;
    if ((this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::append((char *)&local_60);
    }
    else {
      p_Var4 = (this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var1) {
        do {
          std::__cxx11::string::append((char *)&local_60);
          cVar5 = (char)&local_60;
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)(p_Var4 + 1));
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::push_back(cVar5);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var1);
      }
    }
    this_02 = local_38;
    filename = &(local_38->Moc_).CompFileAbs;
    this_00 = &(local_38->super_cmQtAutoGenerator).FileSys_;
    bVar2 = cmQtAutoGenerator::FileSystem::FileDiffers(this_00,filename,&local_60);
    if (bVar2) {
      this_01 = &(this_02->super_cmQtAutoGenerator).Logger_;
      if ((this_02->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
        std::operator+(&local_80,"Generating MOC compilation ",filename);
        cmQtAutoGenerator::Logger::Info(this_01,MOC,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      bVar2 = cmQtAutoGenerator::FileSystem::FileWrite(this_00,MOC,filename,&local_60);
      if (!bVar2) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"mocs compilation file writing failed","");
        cmQtAutoGenerator::Logger::ErrorFile(this_01,MOC,filename,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        RegisterJobError(this_02);
      }
    }
    else if (this_02->MocAutoFileUpdated_ == true) {
      if ((this_02->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
        std::operator+(&local_80,"Touching mocs compilation ",filename);
        cmQtAutoGenerator::Logger::Info(&(this_02->super_cmQtAutoGenerator).Logger_,MOC,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      cmQtAutoGenerator::FileSystem::Touch(this_00,filename,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  pthread_mutex_unlock(local_40);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::MocGenerateCompilation()
{
  std::lock_guard<std::mutex> mocLock(JobsMutex_);
  if (!JobError_ && Moc().Enabled) {
    // Write mocs compilation build file
    {
      // Compose mocs compilation file content
      std::string content =
        "// This file is autogenerated. Changes will be overwritten.\n";
      if (MocAutoFiles_.empty()) {
        // Placeholder content
        content += "// No files found that require moc or the moc files are "
                   "included\n";
        content += "enum some_compilers { need_more_than_nothing };\n";
      } else {
        // Valid content
        char const sbeg = Base().MultiConfig ? '<' : '"';
        char const send = Base().MultiConfig ? '>' : '"';
        for (std::string const& mocfile : MocAutoFiles_) {
          content += "#include ";
          content += sbeg;
          content += mocfile;
          content += send;
          content += '\n';
        }
      }

      std::string const& compAbs = Moc().CompFileAbs;
      if (FileSys().FileDiffers(compAbs, content)) {
        // Actually write mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Generating MOC compilation " + compAbs);
        }
        if (!FileSys().FileWrite(GenT::MOC, compAbs, content)) {
          Log().ErrorFile(GenT::MOC, compAbs,
                          "mocs compilation file writing failed");
          RegisterJobError();
          return;
        }
      } else if (MocAutoFileUpdated_) {
        // Only touch mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Touching mocs compilation " + compAbs);
        }
        FileSys().Touch(compAbs);
      }
    }
    // Write mocs compilation wrapper file
    if (Base().MultiConfig) {
    }
  }
}